

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O1

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::JointToIndividualIndicesStepSize
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          LIndex jointI,LIndex *step_size,size_t vec_size)

{
  long lVar1;
  ulong uVar2;
  unsigned_long_long *__first;
  ulong uVar3;
  unsigned_long_long uStack_20;
  allocator_type local_11;
  
  lVar1 = -(vec_size * 8 + 0xf & 0xfffffffffffffff0);
  __first = (unsigned_long_long *)(&stack0xffffffffffffffe8 + lVar1);
  if (vec_size != 0) {
    uVar3 = 0;
    do {
      uVar2 = jointI / step_size[uVar3];
      jointI = jointI % step_size[uVar3];
      __first[uVar3] = uVar2;
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < vec_size);
  }
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x49651c;
  std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
  vector<unsigned_long_long*,void>
            ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)__return_storage_ptr__
             ,__first,__first + vec_size,&local_11);
  return __return_storage_ptr__;
}

Assistant:

vector<LIndex> IndexTools::JointToIndividualIndicesStepSize(LIndex jointI, 
            const LIndex * step_size, size_t vec_size )
{
    LIndex remainder = jointI;

    LIndex resultArr[vec_size];
    for(Index i=0; i < vec_size ; i++)
    {
        LIndex aI = remainder / step_size[i];
        resultArr[i] = aI;//store this indiv. index
        //remainder = remainder %  step_size[i];
        remainder -= step_size[i] * aI;
    }
    vector<LIndex> result(&resultArr[0], &resultArr[vec_size]);
    return(result);
}